

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O3

void __thiscall Clasp::Asp::SccChecker::visitDfs(SccChecker *this,PrgNode *node,NodeType t)

{
  undefined1 *puVar1;
  size_type *psVar2;
  pointer pCVar3;
  size_type sVar4;
  PrgNode PVar5;
  ulong uVar6;
  bool bVar7;
  uint uVar8;
  PrgAtom *pPVar9;
  PrgAtom *pPVar10;
  Call c;
  Call local_48;
  PrgAtom *local_38;
  
  if (((this->prg_ != (LogicProgram *)0x0) &&
      (PVar5 = *node, ((ulong)PVar5 & 0x4000000080000000) == 0)) &&
     (-1 < (long)PVar5 && (PVar5._0_4_ & 0x7fffffff) != 1)) {
    (this->callStack_).ebo_.size = 0;
    (this->nodeStack_).ebo_.size = 0;
    this->count_ = 0;
    local_48.node = (uintp)(&node->field_0x0 + t);
    local_48.min = 0;
    local_48.next = 0;
    bk_lib::pod_vector<Clasp::Asp::SccChecker::Call,_std::allocator<Clasp::Asp::SccChecker::Call>_>
    ::push_back(&this->callStack_,&local_48);
    sVar4 = (this->callStack_).ebo_.size;
    while (sVar4 != 0) {
      pCVar3 = (this->callStack_).ebo_.buf + (sVar4 - 1);
      local_48.node = pCVar3->node;
      local_48.min = pCVar3->min;
      local_48.next = pCVar3->next;
      (this->callStack_).ebo_.size = sVar4 - 1;
      bVar7 = recurse(this,&local_48);
      if (!bVar7) {
        pPVar9 = (PrgAtom *)(local_48.node & 0xfffffffffffffffc);
        PVar5 = (pPVar9->super_PrgHead).super_PrgNode;
        if (local_48.min < (PVar5._4_4_ & 0xfffffff)) {
          (pPVar9->super_PrgHead).super_PrgNode =
               (PrgNode)(((ulong)PVar5 & 0x30000000ffffffff) + (local_48._8_8_ << 0x20) |
                        0x8000000000000000);
        }
        else if (local_48.node == (this->nodeStack_).ebo_.buf[(this->nodeStack_).ebo_.size - 1]) {
          if ((local_48.node & 3) == 0) {
            puVar1 = &(pPVar9->super_PrgHead).field_0x18;
            *(uint *)puVar1 = *(uint *)puVar1 | 0x7ffffff;
          }
          (pPVar9->super_PrgHead).super_PrgNode =
               (PrgNode)((ulong)PVar5 & 0x30000000ffffffff | 0x8fffffff00000000);
          psVar2 = &(this->nodeStack_).ebo_.size;
          *psVar2 = *psVar2 - 1;
        }
        else {
          do {
            uVar8 = (this->nodeStack_).ebo_.size - 1;
            uVar6 = (this->nodeStack_).ebo_.buf[uVar8];
            pPVar10 = (PrgAtom *)(uVar6 & 0xfffffffffffffffc);
            if ((uVar6 & 3) == 0) {
              *(uint *)&(pPVar10->super_PrgHead).field_0x18 =
                   *(uint *)&(pPVar10->super_PrgHead).field_0x18 & 0xf8000000 |
                   this->sccs_ & 0x7ffffff;
              local_38 = pPVar10;
              bk_lib::pod_vector<Clasp::Asp::PrgAtom_*,_std::allocator<Clasp::Asp::PrgAtom_*>_>::
              push_back(this->sccAtoms_,&local_38);
              uVar8 = (this->nodeStack_).ebo_.size - 1;
            }
            (this->nodeStack_).ebo_.size = uVar8;
            (pPVar10->super_PrgHead).super_PrgNode =
                 (PrgNode)((ulong)(pPVar10->super_PrgHead).super_PrgNode & 0x30000000ffffffff |
                          0x8fffffff00000000);
          } while (pPVar10 != pPVar9);
          this->sccs_ = this->sccs_ + 1;
        }
      }
      sVar4 = (this->callStack_).ebo_.size;
    }
    return;
  }
  return;
}

Assistant:

void SccChecker::visitDfs(PrgNode* node, NodeType t) {
	if (!prg_ || !doVisit(node)) {
		return;
	}
	callStack_.clear();
	nodeStack_.clear();
	count_ = 0;
	addCall(node, t, 0);
	while (!callStack_.empty()) {
		Call c = callStack_.back();
		callStack_.pop_back();
		if (!recurse(c)) {
			node = unpackNode(c.node);
			if (c.min < node->id()) {
				node->resetId( c.min, true );
			}
			else if (c.node == nodeStack_.back()) {
				// node is trivially-connected; all such nodes are in the same Pseudo-SCC
				if (isNode(nodeStack_.back(), PrgNode::Atom)) {
					static_cast<PrgAtom*>(node)->setScc(PrgNode::noScc);
				}
				node->resetId(PrgNode::noNode, true);
				nodeStack_.pop_back();
			}
			else { // non-trivial SCC
				PrgNode* succVertex;
				do {
					succVertex = unpackNode(nodeStack_.back());
					if (isNode(nodeStack_.back(), PrgNode::Atom)) {
						static_cast<PrgAtom*>(succVertex)->setScc(sccs_);
						sccAtoms_->push_back(static_cast<PrgAtom*>(succVertex));
					}
					nodeStack_.pop_back();
					succVertex->resetId(PrgNode::noNode, true);
				} while (succVertex != node);
				++sccs_;
			}
		}
	}
}